

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymul.hpp
# Opt level: O0

int polymul::polynomial<double,_3,_6>::term_index(int *exponents)

{
  int iVar1;
  long lVar2;
  int in_EDX;
  int extraout_EDX;
  int local_20;
  int local_1c;
  int idx;
  int i;
  int i_1;
  int N;
  int *exponents_local;
  
  i = 0;
  for (idx = 0; idx < 3; idx = idx + 1) {
    i = exponents[idx] + i;
  }
  local_1c = 0;
  local_20 = 0;
  for (i = i + -1; -1 < i; i = i - exponents[lVar2]) {
    iVar1 = polylen((polymul *)(ulong)(3 - local_1c),i,in_EDX);
    local_20 = iVar1 + local_20;
    lVar2 = (long)local_1c;
    local_1c = local_1c + 1;
    in_EDX = extraout_EDX;
  }
  return local_20;
}

Assistant:

static int term_index(const int exponents[Nvar]) {
    int N = 0;
    for (int i = 0; i < Nvar; i++)
      N += exponents[i];
    int i = 0, idx = 0;
    N--;
    while (N >= 0) {
      idx += polylen(Nvar - i, N);
      N -= exponents[i];
      i++;
    }
    return idx;
  }